

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_path.cpp
# Opt level: O1

vector<Item_*,_std::allocator<Item_*>_> * __thiscall
WorldPath::missing_items_to_cross
          (vector<Item_*,_std::allocator<Item_*>_> *__return_storage_ptr__,WorldPath *this,
          vector<Item_*,_std::allocator<Item_*>_> *player_inventory_copy,
          bool only_strictly_required_items)

{
  Item **__src;
  pointer *pppIVar1;
  pointer ppIVar2;
  Item **ppIVar3;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> __dest;
  undefined3 in_register_00000009;
  pointer ppIVar4;
  Item *item;
  vector<Item_*,_std::allocator<Item_*>_> items_to_test;
  Item *local_50;
  vector<Item_*,_std::allocator<Item_*>_> local_48;
  
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(&local_48,&this->_required_items);
  if (CONCAT31(in_register_00000009,only_strictly_required_items) == 0) {
    ppIVar4 = (this->_items_placed_when_crossing).
              super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
              _M_start;
    ppIVar2 = (this->_items_placed_when_crossing).
              super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    if (ppIVar4 != ppIVar2) {
      do {
        local_50 = *ppIVar4;
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)&local_48,&local_50);
        ppIVar4 = ppIVar4 + 1;
      } while (ppIVar4 != ppIVar2);
    }
  }
  (__return_storage_ptr__->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    ppIVar4 = local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_50 = *ppIVar4;
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                         ((player_inventory_copy->
                          super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
                          super__Vector_impl_data._M_start,
                          (player_inventory_copy->
                          super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish,&local_50);
      ppIVar3 = (player_inventory_copy->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      if (__dest._M_current == ppIVar3) {
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)__return_storage_ptr__,&local_50);
      }
      else {
        __src = __dest._M_current + 1;
        if (__src != ppIVar3) {
          memmove(__dest._M_current,__src,(long)ppIVar3 - (long)__src);
        }
        pppIVar1 = &(player_inventory_copy->super__Vector_base<Item_*,_std::allocator<Item_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + -1;
      }
      ppIVar4 = ppIVar4 + 1;
    } while (ppIVar4 !=
             local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item*> WorldPath::missing_items_to_cross(std::vector<Item*> player_inventory_copy, bool only_strictly_required_items)
{
    std::vector<Item*> items_to_test = _required_items;
    if(!only_strictly_required_items)
    {
        for(Item* item : _items_placed_when_crossing)
            items_to_test.emplace_back(item);
    }

    std::vector<Item*> missing_items;
    for (Item* item : items_to_test)
    {
        auto iter = std::find(player_inventory_copy.begin(), player_inventory_copy.end(), item);
        if (iter == player_inventory_copy.end())
        {
            missing_items.emplace_back(item);
        }
        else
        {
            // If item has been found, remove it from the inventory copy for it not to count several times
            // (case where quantity needed is > 1)
            player_inventory_copy.erase(iter);
        }
    }

    return missing_items;
}